

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::propagate_nonuniform_qualifier(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  bool bVar4;
  SPIRExpression *pSVar5;
  SPIRCombinedImageSampler *pSVar6;
  SPIRAccessChain *pSVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = (ulong)id;
  while( true ) {
    bVar4 = Compiler::has_decoration(&this->super_Compiler,(ID)(uint32_t)uVar8,DecorationNonUniform)
    ;
    if (!bVar4) {
      Compiler::set_decoration(&this->super_Compiler,(ID)(uint32_t)uVar8,DecorationNonUniform,0);
      Compiler::force_recompile(&this->super_Compiler);
    }
    if ((uVar8 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar1[uVar8].type == TypeExpression)) {
      pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar8);
    }
    else {
      pSVar5 = (SPIRExpression *)0x0;
    }
    if ((uVar8 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar1[uVar8].type == TypeCombinedImageSampler)) {
      pSVar6 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar1 + uVar8);
    }
    else {
      pSVar6 = (SPIRCombinedImageSampler *)0x0;
    }
    if ((uVar8 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar1[uVar8].type == TypeAccessChain)) {
      pSVar7 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar8);
    }
    else {
      pSVar7 = (SPIRAccessChain *)0x0;
    }
    if (pSVar5 != (SPIRExpression *)0x0) break;
    if (pSVar6 == (SPIRCombinedImageSampler *)0x0) {
      if ((pSVar7 != (SPIRAccessChain *)0x0) &&
         (sVar2 = (pSVar7->implied_read_expressions).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size,
         sVar2 != 0)) {
        pTVar3 = (pSVar7->implied_read_expressions).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        lVar9 = 0;
        do {
          propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar3->id + lVar9));
          lVar9 = lVar9 + 4;
        } while (sVar2 << 2 != lVar9);
      }
      return;
    }
    propagate_nonuniform_qualifier(this,(pSVar6->image).id);
    uVar8 = (ulong)(pSVar6->sampler).id;
  }
  sVar2 = (pSVar5->expression_dependencies).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (pSVar5->expression_dependencies).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar9 = 0;
    do {
      propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar3->id + lVar9));
      lVar9 = lVar9 + 4;
    } while (sVar2 << 2 != lVar9);
  }
  sVar2 = (pSVar5->implied_read_expressions).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    return;
  }
  pTVar3 = (pSVar5->implied_read_expressions).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  lVar9 = 0;
  do {
    propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar3->id + lVar9));
    lVar9 = lVar9 + 4;
  } while (sVar2 << 2 != lVar9);
  return;
}

Assistant:

void CompilerGLSL::propagate_nonuniform_qualifier(uint32_t id)
{
	// SPIR-V might only tag the very last ID with NonUniformEXT, but for codegen,
	// we need to know NonUniformEXT a little earlier, when the resource is actually loaded.
	// Back-propagate the qualifier based on the expression dependency chain.

	if (!has_decoration(id, DecorationNonUniformEXT))
	{
		set_decoration(id, DecorationNonUniformEXT);
		force_recompile();
	}

	auto *e = maybe_get<SPIRExpression>(id);
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);
	auto *chain = maybe_get<SPIRAccessChain>(id);
	if (e)
	{
		for (auto &expr : e->expression_dependencies)
			propagate_nonuniform_qualifier(expr);
		for (auto &expr : e->implied_read_expressions)
			propagate_nonuniform_qualifier(expr);
	}
	else if (combined)
	{
		propagate_nonuniform_qualifier(combined->image);
		propagate_nonuniform_qualifier(combined->sampler);
	}
	else if (chain)
	{
		for (auto &expr : chain->implied_read_expressions)
			propagate_nonuniform_qualifier(expr);
	}
}